

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MemoryBuffer.cpp
# Opt level: O1

unique_ptr<llvm::WritableMemoryBuffer,_std::default_delete<llvm::WritableMemoryBuffer>_> __thiscall
llvm::WritableMemoryBuffer::getNewUninitMemBuffer
          (WritableMemoryBuffer *this,size_t Size,Twine *BufferName)

{
  _func_int **pp_Var1;
  _func_int *p_Var2;
  size_t __n;
  ulong uVar3;
  StringRef SVar4;
  SmallString<256U> NameBuf;
  SmallVectorImpl<char> local_140;
  undefined1 local_130 [256];
  
  local_140.super_SmallVectorTemplateBase<char,_true>.super_SmallVectorTemplateCommon<char,_void>.
  super_SmallVectorBase.BeginX = local_130;
  local_140.super_SmallVectorTemplateBase<char,_true>.super_SmallVectorTemplateCommon<char,_void>.
  super_SmallVectorBase.Size = 0;
  local_140.super_SmallVectorTemplateBase<char,_true>.super_SmallVectorTemplateCommon<char,_void>.
  super_SmallVectorBase.Capacity = 0x100;
  SVar4 = Twine::toStringRef(BufferName,&local_140);
  __n = SVar4.Length;
  uVar3 = __n + 0x28 & 0xfffffffffffffff0;
  pp_Var1 = (_func_int **)operator_new(Size + uVar3 + 1,(nothrow_t *)&std::nothrow);
  if (pp_Var1 == (_func_int **)0x0) {
    (this->super_MemoryBuffer)._vptr_MemoryBuffer = (_func_int **)0x0;
    pp_Var1 = (_func_int **)0x0;
  }
  else {
    if (__n != 0) {
      memcpy(pp_Var1 + 3,SVar4.Data,__n);
    }
    *(undefined1 *)((long)pp_Var1 + __n + 0x18) = 0;
    p_Var2 = (_func_int *)((long)pp_Var1 + uVar3);
    p_Var2[Size] = (_func_int)0x0;
    *pp_Var1 = (_func_int *)&PTR__MemoryBuffer_0023f8e8;
    pp_Var1[1] = p_Var2;
    pp_Var1[2] = p_Var2 + Size;
  }
  (this->super_MemoryBuffer)._vptr_MemoryBuffer = pp_Var1;
  if ((undefined1 *)
      local_140.super_SmallVectorTemplateBase<char,_true>.
      super_SmallVectorTemplateCommon<char,_void>.super_SmallVectorBase.BeginX != local_130) {
    free(local_140.super_SmallVectorTemplateBase<char,_true>.
         super_SmallVectorTemplateCommon<char,_void>.super_SmallVectorBase.BeginX);
  }
  return (__uniq_ptr_data<llvm::WritableMemoryBuffer,_std::default_delete<llvm::WritableMemoryBuffer>,_true,_true>
          )(__uniq_ptr_data<llvm::WritableMemoryBuffer,_std::default_delete<llvm::WritableMemoryBuffer>,_true,_true>
            )this;
}

Assistant:

std::unique_ptr<WritableMemoryBuffer>
WritableMemoryBuffer::getNewUninitMemBuffer(size_t Size, const Twine &BufferName) {
  using MemBuffer = MemoryBufferMem<WritableMemoryBuffer>;
  // Allocate space for the MemoryBuffer, the data and the name. It is important
  // that MemoryBuffer and data are aligned so PointerIntPair works with them.
  // TODO: Is 16-byte alignment enough?  We copy small object files with large
  // alignment expectations into this buffer.
  SmallString<256> NameBuf;
  StringRef NameRef = BufferName.toStringRef(NameBuf);
  size_t AlignedStringLen = alignTo(sizeof(MemBuffer) + NameRef.size() + 1, 16);
  size_t RealLen = AlignedStringLen + Size + 1;
  char *Mem = static_cast<char*>(operator new(RealLen, std::nothrow));
  if (!Mem)
    return nullptr;

  // The name is stored after the class itself.
  CopyStringRef(Mem + sizeof(MemBuffer), NameRef);

  // The buffer begins after the name and must be aligned.
  char *Buf = Mem + AlignedStringLen;
  Buf[Size] = 0; // Null terminate buffer.

  auto *Ret = new (Mem) MemBuffer(StringRef(Buf, Size), true);
  return std::unique_ptr<WritableMemoryBuffer>(Ret);
}